

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_AddOption_Test::SolverTest_AddOption_Test(SolverTest_AddOption_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__SolverTest_AddOption_Test_00397fc8;
  return;
}

Assistant:

TEST(SolverTest, AddOption) {
  struct TestOption : SolverOption {
    int value;
    TestOption() : SolverOption("testopt", "A test option."), value(0) {}

    void Write(fmt::Writer &) {}
    void Parse(const char *&s, bool=false) {
      char *end = 0;
      value = std::strtol(s, &end, 10);
      s = end;
    }
    virtual Option_Type type() { return BOOL; }
  };
  TestSolver s;
  TestOption *opt = 0;
  s.AddOption(SolverOptionPtr(opt = new TestOption()));
  EXPECT_TRUE(s.ParseOptions(Args("testopt=42"), Solver::NO_OPTION_ECHO));
  EXPECT_EQ(42, opt->value);
}